

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlogin.c
# Opt level: O2

int rlogin_exitcode(Backend *be)

{
  int iVar1;
  
  if (be[-6].interactor != (Interactor *)0x0) {
    return -1;
  }
  iVar1 = 0x7fffffff;
  if (*(char *)&be[-5].vt == '\0') {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int rlogin_exitcode(Backend *be)
{
    Rlogin *rlogin = container_of(be, Rlogin, backend);
    if (rlogin->s != NULL)
        return -1;                     /* still connected */
    else if (rlogin->closed_on_socket_error)
        return INT_MAX;     /* a socket error counts as an unclean exit */
    else
        /* If we ever implement RSH, we'll probably need to do this properly */
        return 0;
}